

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

void whisper_reset_timings(whisper_context *ctx)

{
  whisper_state *pwVar1;
  int64_t iVar2;
  
  iVar2 = ggml_time_us();
  ctx->t_start_us = iVar2;
  pwVar1 = ctx->state;
  if (pwVar1 != (whisper_state *)0x0) {
    pwVar1->n_sample = 0;
    pwVar1->n_encode = 0;
    pwVar1->n_decode = 0;
    pwVar1->n_batchd = 0;
    pwVar1->t_prompt_us = 0;
    pwVar1->t_mel_us = 0;
    pwVar1->t_decode_us = 0;
    pwVar1->t_batchd_us = 0;
    pwVar1->t_sample_us = 0;
    pwVar1->t_encode_us = 0;
    pwVar1->n_prompt = 0;
  }
  return;
}

Assistant:

void whisper_reset_timings(struct whisper_context * ctx) {
    ctx->t_start_us = ggml_time_us();
    if (ctx->state != nullptr) {
        ctx->state->t_mel_us = 0;
        ctx->state->t_sample_us = 0;
        ctx->state->t_encode_us = 0;
        ctx->state->t_decode_us = 0;
        ctx->state->t_batchd_us = 0;
        ctx->state->t_prompt_us = 0;
        ctx->state->n_sample = 0;
        ctx->state->n_encode = 0;
        ctx->state->n_decode = 0;
        ctx->state->n_batchd = 0;
        ctx->state->n_prompt = 0;
    }
}